

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_encoder_isac_t_impl.h
# Opt level: O0

void __thiscall
webrtc::AudioEncoderIsacT<webrtc::IsacFloat>::RecreateEncoderInstance
          (AudioEncoderIsacT<webrtc::IsacFloat> *this,Config *config)

{
  bool bVar1;
  ostream *poVar2;
  int32_t local_fd4;
  FatalMessage local_f80;
  int16_t local_e06;
  int local_e04;
  string *local_e00;
  string *_result_8;
  int16_t local_c7e;
  int local_c7c;
  string *local_c78;
  string *_result_7;
  int16_t local_af6;
  int local_af4;
  string *local_af0;
  string *_result_6;
  int16_t local_96e;
  int local_96c;
  string *local_968;
  string *_result_5;
  int16_t local_7e6;
  int local_7e4;
  string *local_7e0;
  string *_result_4;
  undefined1 local_7d0 [4];
  int bit_rate;
  int16_t local_656;
  int local_654;
  string *local_650;
  string *_result_3;
  int16_t local_4ce;
  int local_4cc;
  string *local_4c8;
  string *_result_2;
  int16_t local_346;
  int local_344;
  string *local_340;
  string *_result_1;
  int16_t local_1be;
  int local_1bc;
  string *local_1b8;
  string *_result;
  byte local_199;
  FatalMessage local_198;
  FatalMessageVoidify local_19;
  Config *local_18;
  Config *config_local;
  AudioEncoderIsacT<webrtc::IsacFloat> *this_local;
  
  local_18 = config;
  config_local = (Config *)this;
  bVar1 = Config::IsOk(config);
  local_199 = 0;
  if (!bVar1) {
    rtc::FatalMessageVoidify::FatalMessageVoidify(&local_19);
    rtc::FatalMessage::FatalMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_coding/codecs/isac/audio_encoder_isac_t_impl.h"
               ,0x9e);
    local_199 = 1;
    poVar2 = rtc::FatalMessage::stream(&local_198);
    poVar2 = std::operator<<(poVar2,"Check failed: config.IsOk()");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<(poVar2,"# ");
    rtc::FatalMessageVoidify::operator&(&local_19,poVar2);
  }
  if ((local_199 & 1) != 0) {
    rtc::FatalMessage::~FatalMessage(&local_198);
  }
  this->packet_in_progress_ = false;
  rtc::scoped_refptr<webrtc::LockedIsacBandwidthInfo>::operator=(&this->bwinfo_,&local_18->bwinfo);
  if (this->isac_state_ != (instance_type *)0x0) {
    local_1bc = 0;
    local_1be = IsacFloat::Free(this->isac_state_);
    local_1b8 = rtc::CheckEQImpl<int,short>(&local_1bc,&local_1be,"0 == T::Free(isac_state_)");
    if (local_1b8 != (string *)0x0) {
      rtc::FatalMessage::FatalMessage
                ((FatalMessage *)&_result_1,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_coding/codecs/isac/audio_encoder_isac_t_impl.h"
                 ,0xa2,local_1b8);
      rtc::FatalMessage::stream((FatalMessage *)&_result_1);
      rtc::FatalMessage::~FatalMessage((FatalMessage *)&_result_1);
    }
    local_1b8 = (string *)0x0;
  }
  local_344 = 0;
  local_346 = IsacFloat::Create(&this->isac_state_);
  local_340 = rtc::CheckEQImpl<int,short>(&local_344,&local_346,"0 == T::Create(&isac_state_)");
  if (local_340 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              ((FatalMessage *)&_result_2,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_coding/codecs/isac/audio_encoder_isac_t_impl.h"
               ,0xa3,local_340);
    rtc::FatalMessage::stream((FatalMessage *)&_result_2);
    rtc::FatalMessage::~FatalMessage((FatalMessage *)&_result_2);
  }
  local_4cc = 0;
  local_4ce = IsacFloat::EncoderInit
                        (this->isac_state_,(ushort)((local_18->adaptive_mode & 1U) == 0));
  local_4c8 = rtc::CheckEQImpl<int,short>
                        (&local_4cc,&local_4ce,
                         "0 == T::EncoderInit(isac_state_, config.adaptive_mode ? 0 : 1)");
  if (local_4c8 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              ((FatalMessage *)&_result_3,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_coding/codecs/isac/audio_encoder_isac_t_impl.h"
               ,0xa4,local_4c8);
    rtc::FatalMessage::stream((FatalMessage *)&_result_3);
    rtc::FatalMessage::~FatalMessage((FatalMessage *)&_result_3);
  }
  local_654 = 0;
  local_656 = IsacFloat::SetEncSampRate(this->isac_state_,(uint16_t)local_18->sample_rate_hz);
  local_650 = rtc::CheckEQImpl<int,short>
                        (&local_654,&local_656,
                         "0 == T::SetEncSampRate(isac_state_, config.sample_rate_hz)");
  if (local_650 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              ((FatalMessage *)local_7d0,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_coding/codecs/isac/audio_encoder_isac_t_impl.h"
               ,0xa5,local_650);
    rtc::FatalMessage::stream((FatalMessage *)local_7d0);
    rtc::FatalMessage::~FatalMessage((FatalMessage *)local_7d0);
  }
  if (local_18->bit_rate == 0) {
    local_fd4 = 32000;
  }
  else {
    local_fd4 = local_18->bit_rate;
  }
  _result_4._4_4_ = local_fd4;
  if ((local_18->adaptive_mode & 1U) == 0) {
    local_96c = 0;
    local_96e = IsacFloat::Control(this->isac_state_,local_fd4,local_18->frame_size_ms);
    local_968 = rtc::CheckEQImpl<int,short>
                          (&local_96c,&local_96e,
                           "0 == T::Control(isac_state_, bit_rate, config.frame_size_ms)");
    if (local_968 != (string *)0x0) {
      rtc::FatalMessage::FatalMessage
                ((FatalMessage *)&_result_6,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_coding/codecs/isac/audio_encoder_isac_t_impl.h"
                 ,0xab,local_968);
      rtc::FatalMessage::stream((FatalMessage *)&_result_6);
      rtc::FatalMessage::~FatalMessage((FatalMessage *)&_result_6);
    }
    local_968 = (string *)0x0;
  }
  else {
    local_7e4 = 0;
    local_7e6 = IsacFloat::ControlBwe
                          (this->isac_state_,local_fd4,local_18->frame_size_ms,
                           (ushort)(local_18->enforce_frame_size & 1));
    local_7e0 = rtc::CheckEQImpl<int,short>
                          (&local_7e4,&local_7e6,
                           "0 == T::ControlBwe(isac_state_, bit_rate, config.frame_size_ms, config.enforce_frame_size)"
                          );
    if (local_7e0 != (string *)0x0) {
      rtc::FatalMessage::FatalMessage
                ((FatalMessage *)&_result_5,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_coding/codecs/isac/audio_encoder_isac_t_impl.h"
                 ,0xa9,local_7e0);
      rtc::FatalMessage::stream((FatalMessage *)&_result_5);
      rtc::FatalMessage::~FatalMessage((FatalMessage *)&_result_5);
    }
    local_7e0 = (string *)0x0;
  }
  if (local_18->max_payload_size_bytes != -1) {
    local_af4 = 0;
    local_af6 = IsacFloat::SetMaxPayloadSize
                          (this->isac_state_,(int16_t)local_18->max_payload_size_bytes);
    local_af0 = rtc::CheckEQImpl<int,short>
                          (&local_af4,&local_af6,
                           "0 == T::SetMaxPayloadSize(isac_state_, config.max_payload_size_bytes)");
    if (local_af0 != (string *)0x0) {
      rtc::FatalMessage::FatalMessage
                ((FatalMessage *)&_result_7,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_coding/codecs/isac/audio_encoder_isac_t_impl.h"
                 ,0xaf,local_af0);
      rtc::FatalMessage::stream((FatalMessage *)&_result_7);
      rtc::FatalMessage::~FatalMessage((FatalMessage *)&_result_7);
    }
    local_af0 = (string *)0x0;
  }
  if (local_18->max_bit_rate != -1) {
    local_c7c = 0;
    local_c7e = IsacFloat::SetMaxRate(this->isac_state_,local_18->max_bit_rate);
    local_c78 = rtc::CheckEQImpl<int,short>
                          (&local_c7c,&local_c7e,
                           "0 == T::SetMaxRate(isac_state_, config.max_bit_rate)");
    if (local_c78 != (string *)0x0) {
      rtc::FatalMessage::FatalMessage
                ((FatalMessage *)&_result_8,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_coding/codecs/isac/audio_encoder_isac_t_impl.h"
                 ,0xb1,local_c78);
      rtc::FatalMessage::stream((FatalMessage *)&_result_8);
      rtc::FatalMessage::~FatalMessage((FatalMessage *)&_result_8);
    }
    local_c78 = (string *)0x0;
  }
  local_e04 = 0;
  local_e06 = IsacFloat::SetDecSampRate(this->isac_state_,(uint16_t)local_18->sample_rate_hz);
  local_e00 = rtc::CheckEQImpl<int,short>
                        (&local_e04,&local_e06,
                         "0 == T::SetDecSampRate(isac_state_, config.sample_rate_hz)");
  if (local_e00 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_f80,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_coding/codecs/isac/audio_encoder_isac_t_impl.h"
               ,0xb7,local_e00);
    rtc::FatalMessage::stream(&local_f80);
    rtc::FatalMessage::~FatalMessage(&local_f80);
  }
  Config::operator=(&this->config_,local_18);
  return;
}

Assistant:

void AudioEncoderIsacT<T>::RecreateEncoderInstance(const Config& config) {
  RTC_CHECK(config.IsOk());
  packet_in_progress_ = false;
  bwinfo_ = config.bwinfo;
  if (isac_state_)
    RTC_CHECK_EQ(0, T::Free(isac_state_));
  RTC_CHECK_EQ(0, T::Create(&isac_state_));
  RTC_CHECK_EQ(0, T::EncoderInit(isac_state_, config.adaptive_mode ? 0 : 1));
  RTC_CHECK_EQ(0, T::SetEncSampRate(isac_state_, config.sample_rate_hz));
  const int bit_rate = config.bit_rate == 0 ? kDefaultBitRate : config.bit_rate;
  if (config.adaptive_mode) {
    RTC_CHECK_EQ(0, T::ControlBwe(isac_state_, bit_rate, config.frame_size_ms,
                                  config.enforce_frame_size));
  } else {
    RTC_CHECK_EQ(0, T::Control(isac_state_, bit_rate, config.frame_size_ms));
  }
  if (config.max_payload_size_bytes != -1)
    RTC_CHECK_EQ(
        0, T::SetMaxPayloadSize(isac_state_, config.max_payload_size_bytes));
  if (config.max_bit_rate != -1)
    RTC_CHECK_EQ(0, T::SetMaxRate(isac_state_, config.max_bit_rate));

  // Set the decoder sample rate even though we just use the encoder. This
  // doesn't appear to be necessary to produce a valid encoding, but without it
  // we get an encoding that isn't bit-for-bit identical with what a combined
  // encoder+decoder object produces.
  RTC_CHECK_EQ(0, T::SetDecSampRate(isac_state_, config.sample_rate_hz));

  config_ = config;
}